

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O2

int run_test_utf8_decode1(void)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uStack_70;
  char *p;
  char b [32];
  char *local_38;
  
  p = b;
  snprintf(b,0x20,"%c\x7f",0);
  uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
  if (uVar5 == 0) {
    if (p == b + 1) {
      uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
      pcVar6 = p;
      if (uVar5 == 0x7f) {
        if (p == b + 2) {
          builtin_strncpy(b,"\x80߿",5);
          p = b;
          uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
          if (uVar5 == 0x80) {
            if (p == pcVar6) {
              uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
              pcVar2 = p;
              if (uVar5 == 0x7ff) {
                if (p == b + 4) {
                  builtin_strncpy(b,"ࠀ\xffff",7);
                  p = b;
                  uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                  if (uVar5 == 0x800) {
                    if (p == b + 3) {
                      local_38 = p;
                      uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                      pcVar3 = p;
                      if (uVar5 == 0xffff) {
                        if (p == b + 6) {
                          builtin_strncpy(b,"𐀀\x0010ffff",9);
                          p = b;
                          uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                          if (uVar5 == 0x10000) {
                            if (p == pcVar2) {
                              uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                              pcVar4 = p;
                              if (uVar5 == 0x10ffff) {
                                if (p == b + 8) {
                                  b[0] = -0xc;
                                  b[1] = -0x70;
                                  b[2] = -0x40;
                                  b[3] = -0x40;
                                  b[4] = -9;
                                  b[5] = -0x41;
                                  b[6] = -0x41;
                                  b[7] = -0x41;
                                  b[8] = '\0';
                                  p = b;
                                  uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                                  if (uVar5 == 0xffffffff) {
                                    if (p == pcVar2) {
                                      uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                                      if (uVar5 == 0xffffffff) {
                                        if (p == pcVar4) {
                                          builtin_strncpy(b,"",5);
                                          p = b;
                                          uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                                          if (uVar5 == 0xffffffff) {
                                            if (p == pcVar6) {
                                              uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                                              if (uVar5 == 0xffffffff) {
                                                if (p == pcVar2) {
                                                  b[0] = -0x13;
                                                  b[1] = -0x60;
                                                  b[2] = -0x80;
                                                  b[3] = -0x13;
                                                  b[4] = -0x5d;
                                                  b[5] = -0x41;
                                                  b[6] = '\0';
                                                  p = b;
                                                  uVar5 = uv__utf8_decode1(&p,(char *)&local_38);
                                                  if (uVar5 == 0xffffffff) {
                                                    if (p == local_38) {
                                                      uVar5 = uv__utf8_decode1(&p,(char *)&local_38)
                                                      ;
                                                      if (uVar5 == 0xffffffff) {
                                                        if (p == pcVar3) {
                                                          b[0] = -8;
                                                          b[1] = -7;
                                                          b[2] = -6;
                                                          b[3] = -5;
                                                          b[4] = -4;
                                                          b[5] = -3;
                                                          b[6] = -2;
                                                          b[7] = -1;
                                                          b[8] = '\0';
                                                          lVar7 = 0;
                                                          p = b;
                                                          do {
                                                            if (lVar7 == 8) {
                                                              return 0;
                                                            }
                                                            uVar5 = uv__utf8_decode1(&p,(char *)&
                                                  local_38);
                                                  if (uVar5 != 0xffffffff) {
                                                    pcVar6 = 
                                                  "(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))"
                                                  ;
                                                  uStack_70 = 0x5c;
                                                  goto LAB_0013269e;
                                                  }
                                                  lVar1 = lVar7 + 1;
                                                  lVar7 = lVar7 + 1;
                                                  } while (b + lVar1 == p);
                                                  pcVar6 = "p == b + i";
                                                  uStack_70 = 0x5d;
                                                  }
                                                  else {
                                                    pcVar6 = "p == b + 6";
                                                    uStack_70 = 0x55;
                                                  }
                                                  }
                                                  else {
                                                    pcVar6 = 
                                                  "(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))"
                                                  ;
                                                  uStack_70 = 0x54;
                                                  }
                                                  }
                                                  else {
                                                    pcVar6 = "p == b + 3";
                                                    uStack_70 = 0x53;
                                                  }
                                                  }
                                                  else {
                                                    pcVar6 = 
                                                  "(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))"
                                                  ;
                                                  uStack_70 = 0x52;
                                                  }
                                                }
                                                else {
                                                  pcVar6 = "p == b + 4";
                                                  uStack_70 = 0x4d;
                                                }
                                              }
                                              else {
                                                pcVar6 = 
                                                "(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))"
                                                ;
                                                uStack_70 = 0x4c;
                                              }
                                            }
                                            else {
                                              pcVar6 = "p == b + 2";
                                              uStack_70 = 0x4b;
                                            }
                                          }
                                          else {
                                            pcVar6 = 
                                            "(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))";
                                            uStack_70 = 0x4a;
                                          }
                                        }
                                        else {
                                          pcVar6 = "p == b + 8";
                                          uStack_70 = 0x45;
                                        }
                                      }
                                      else {
                                        pcVar6 = 
                                        "(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))";
                                        uStack_70 = 0x44;
                                      }
                                    }
                                    else {
                                      pcVar6 = "p == b + 4";
                                      uStack_70 = 0x43;
                                    }
                                  }
                                  else {
                                    pcVar6 = "(unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b))";
                                    uStack_70 = 0x42;
                                  }
                                }
                                else {
                                  pcVar6 = "p == b + 8";
                                  uStack_70 = 0x3d;
                                }
                              }
                              else {
                                pcVar6 = "0x10FFFF == uv__utf8_decode1(&p, b + sizeof(b))";
                                uStack_70 = 0x3c;
                              }
                            }
                            else {
                              pcVar6 = "p == b + 4";
                              uStack_70 = 0x3b;
                            }
                          }
                          else {
                            pcVar6 = "0x10000 == uv__utf8_decode1(&p, b + sizeof(b))";
                            uStack_70 = 0x3a;
                          }
                        }
                        else {
                          pcVar6 = "p == b + 6";
                          uStack_70 = 0x35;
                        }
                      }
                      else {
                        pcVar6 = "0xFFFF == uv__utf8_decode1(&p, b + sizeof(b))";
                        uStack_70 = 0x34;
                      }
                    }
                    else {
                      pcVar6 = "p == b + 3";
                      uStack_70 = 0x33;
                    }
                  }
                  else {
                    pcVar6 = "0x800 == uv__utf8_decode1(&p, b + sizeof(b))";
                    uStack_70 = 0x32;
                  }
                }
                else {
                  pcVar6 = "p == b + 4";
                  uStack_70 = 0x2d;
                }
              }
              else {
                pcVar6 = "0x7FF == uv__utf8_decode1(&p, b + sizeof(b))";
                uStack_70 = 0x2c;
              }
            }
            else {
              pcVar6 = "p == b + 2";
              uStack_70 = 0x2b;
            }
          }
          else {
            pcVar6 = "128 == uv__utf8_decode1(&p, b + sizeof(b))";
            uStack_70 = 0x2a;
          }
        }
        else {
          pcVar6 = "p == b + 2";
          uStack_70 = 0x25;
        }
      }
      else {
        pcVar6 = "127 == uv__utf8_decode1(&p, b + sizeof(b))";
        uStack_70 = 0x24;
      }
    }
    else {
      pcVar6 = "p == b + 1";
      uStack_70 = 0x23;
    }
  }
  else {
    pcVar6 = "0 == uv__utf8_decode1(&p, b + sizeof(b))";
    uStack_70 = 0x22;
  }
LAB_0013269e:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-idna.c"
          ,uStack_70,pcVar6);
  abort();
}

Assistant:

TEST_IMPL(utf8_decode1) {
  const char* p;
  char b[32];
  int i;

  /* ASCII. */
  p = b;
  snprintf(b, sizeof(b), "%c\x7F", 0x00);
  ASSERT(0 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 1);
  ASSERT(127 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);

  /* Two-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xC2\x80\xDF\xBF");
  ASSERT(128 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT(0x7FF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Three-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xE0\xA0\x80\xEF\xBF\xBF");
  ASSERT(0x800 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT(0xFFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Four-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xF0\x90\x80\x80\xF4\x8F\xBF\xBF");
  ASSERT(0x10000 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT(0x10FFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Four-byte sequences > U+10FFFF; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xF4\x90\xC0\xC0\xF7\xBF\xBF\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Overlong; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xC0\x80\xC1\x80");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Surrogate pairs; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xED\xA0\x80\xED\xA3\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Simply illegal. */
  p = b;
  snprintf(b, sizeof(b), "\xF8\xF9\xFA\xFB\xFC\xFD\xFE\xFF");

  for (i = 1; i <= 8; i++) {
    ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
    ASSERT(p == b + i);
  }

  return 0;
}